

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int isViableStructurePos(int structureType,Generator *g,int x,int z,uint32_t flags)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint biomeID;
  ulong uVar7;
  uint64_t uVar8;
  Layer *pLVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  Layer *pLVar20;
  int z_00;
  int iVar21;
  uint64_t r;
  long lVar22;
  uint x_00;
  uint uVar23;
  uint z_01;
  uint z_02;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  byte bVar28;
  long local_160;
  long local_120;
  Layer *local_118;
  int data [2];
  StructureVariant sv_1;
  int local_d8;
  int local_d0;
  Layer lbiome;
  Layer lshore;
  
  bVar28 = 0;
  uVar24 = x >> 4;
  z_02 = z >> 4;
  uVar23 = g->dim;
  if (uVar23 == 1) {
    if (structureType == 0x15) {
      if (g->mc < 0x10) {
        return 0;
      }
    }
    else {
      if (structureType != 0x14) {
        return 0;
      }
      if (g->mc < 0xc) {
        return 0;
      }
    }
    iVar4 = getBiomeAt(g,0x10,uVar24,0,z_02);
    iVar5 = isViableFeatureBiome(g->mc,structureType,iVar4);
    if (iVar5 != 0) {
      return iVar4;
    }
    return 0;
  }
  lVar22 = (long)(int)uVar24;
  lVar18 = (long)(int)z_02;
  if (uVar23 == 0xffffffff) {
    uVar23 = g->mc;
    if (structureType != 0x12) {
      if ((int)uVar23 < 0x13) {
        return 0;
      }
      if (structureType == 0xc) {
        return 1;
      }
      if (structureType == 0x13 && 0x15 < uVar23) {
        getVariant((StructureVariant *)&lbiome,0x13,uVar23,g->seed,x,z,-1);
        lVar22 = (long)lbiome.scale._2_2_ + lVar22 * 0x20;
        iVar4 = (int)(((lVar22 + (long)(short)lbiome._8_2_ * 2) -
                      (lVar22 + (long)(short)lbiome._8_2_ * 2 + -1 >> 0x3f)) - 1U >> 3);
        lVar18 = (long)lbiome.layerSalt._2_2_ + lVar18 * 0x20;
        iVar5 = (int)(((lVar18 + (long)(short)lbiome.scale * 2) -
                      (lVar18 + (long)(short)lbiome.scale * 2 + -1 >> 0x3f)) - 1U >> 3);
        iVar10 = (uint)(0x16 < g->mc) << 3;
      }
      else {
        iVar4 = uVar24 * 4 + 2;
        iVar5 = z_02 * 4 + 2;
        iVar10 = 0;
      }
      iVar4 = getBiomeAt(g,4,iVar4,iVar10,iVar5);
      iVar4 = isViableFeatureBiome(g->mc,structureType,iVar4);
      return iVar4;
    }
    if ((int)uVar23 < 0x16) {
      return 1;
    }
    lbiome.getMap._0_4_ =
         x / 0x1b0 - (uint)(0x97b424 < (x * 0x684bda13 + 0x4bda120U >> 4 | x * 0x30000000) && x < 0)
    ;
    lbiome.getMap._4_4_ =
         z / 0x1b0 - (uint)(0x97b424 < (z * 0x684bda13 + 0x4bda120U >> 4 | z * 0x30000000) && z < 0)
    ;
    iVar4 = getStructurePos(0x13,uVar23,g->seed,(int)lbiome.getMap,lbiome.getMap._4_4_,
                            (Pos *)&lbiome);
    if (iVar4 != 0) {
      iVar4 = isViableStructurePos(0x13,g,x,z,flags);
      return (uint)(iVar4 == 0);
    }
    return 1;
  }
  iVar4 = g->mc;
  if (iVar4 < 0x16) {
    pLVar9 = (g->field_5).field_0.ls.layers + 0x15;
    pLVar20 = &lbiome;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      pLVar20->getMap = pLVar9->getMap;
      pLVar9 = (Layer *)&pLVar9->mc;
      pLVar20 = (Layer *)&pLVar20->mc;
    }
    pLVar9 = (g->field_5).field_0.ls.layers + 0x22;
    pLVar20 = &lshore;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      pLVar20->getMap = pLVar9->getMap;
      pLVar9 = (Layer *)&pLVar9->mc;
      pLVar20 = (Layer *)&pLVar20->mc;
    }
    local_118 = (g->field_5).field_0.entry;
    (g->field_5).field_0.ls.layers[0x15].data = data;
    (g->field_5).field_0.ls.layers[0x15].getMap = mapViableBiome;
    (g->field_5).field_0.ls.layers[0x22].data = data;
    (g->field_5).field_0.ls.layers[0x22].getMap = mapViableShore;
  }
  else {
    local_118 = (Layer *)0x0;
  }
  data[0] = structureType;
  data[1] = iVar4;
  if (0x17 < structureType - 1U) {
switchD_0010d1ad_caseD_12:
    fprintf(_stderr,"isViableStructurePos: bad structure type %d or dimension %d\n",
            (ulong)(uint)structureType,(ulong)uVar23);
    iVar5 = 0;
    goto LAB_0010d5b1;
  }
  x_00 = x >> 2;
  z_01 = z >> 2;
  biomeID = 0;
  switch(structureType) {
  case 1:
  case 2:
  case 3:
    goto switchD_0010d1ad_caseD_1;
  case 4:
    if (iVar4 < 0xc) goto LAB_0010d5af;
    goto switchD_0010d1ad_caseD_1;
  case 5:
    if (iVar4 < 0x16) {
      if (iVar4 == 0x12) {
        pLVar9 = (Layer *)((long)&g->field_5 + 0xfc0);
        uVar23 = x & 0xfffffff0U | 9;
        uVar24 = z & 0xfffffff0U | 9;
      }
      else {
        pLVar9 = (Layer *)((long)&g->field_5 + 0xd38);
        uVar23 = uVar24 * 4 + 2;
        uVar24 = z_02 * 4 + 2;
      }
      (g->field_5).field_0.entry = pLVar9;
      iVar5 = 0;
      biomeID = getBiomeAt(g,0,uVar23,0,uVar24);
      if (((-1 < (int)biomeID) &&
          ((((iVar4 = g->mc, biomeID < 0x24 && ((0x800000006U >> ((ulong)biomeID & 0x3f) & 1) != 0))
            || (biomeID == 5 && 0xc < iVar4)) ||
           ((biomeID == 0xc && 0x10 < iVar4 || (biomeID == 0xb1 && 0x15 < iVar4)))))) &&
         ((flags == 0 || (biomeID == flags)))) {
        if (iVar4 < 0xd) {
          iVar5 = 0;
          uVar23 = getBiomeAt(g,1,x & 0xfffffff0U | 2,0,z & 0xfffffff0U | 2);
          if (((int)uVar23 < 0) ||
             (((iVar4 = g->mc, 0x23 < uVar23 ||
               (biomeID = uVar23, (0x800000006U >> ((ulong)uVar23 & 0x3f) & 1) == 0)) &&
              ((biomeID = 5, uVar23 != 5 || iVar4 < 0xd &&
               ((biomeID = 0xc, uVar23 != 0xc || iVar4 < 0x11 &&
                (biomeID = 0xb1, uVar23 != 0xb1 || iVar4 < 0x16)))))))) break;
        }
        goto switchD_0010d1ad_caseD_f;
      }
    }
    else {
      lVar12 = 0;
      do {
        biomeID = *(uint *)((long)&DAT_0012ca80 + lVar12);
        if ((flags == 0) || (biomeID = flags, *(uint *)((long)&DAT_0012ca80 + lVar12) == flags)) {
          getVariant(&sv_1,5,g->mc,g->seed,x,z,biomeID);
          lVar2 = (long)sv_1.sx + lVar22 * 0x20 + -1 + (long)sv_1.x * 2;
          lVar3 = (long)sv_1.sz + lVar18 * 0x20 + -1 + (long)sv_1.z * 2;
          uVar23 = getBiomeAt(g,0,(int)((ulong)(lVar2 - (lVar2 >> 0x3f)) >> 3),0x4f,
                              (int)((ulong)(lVar3 - (lVar3 >> 0x3f)) >> 3));
          if ((uVar23 == biomeID) || ((lVar12 == 0 && (uVar23 == 0xb1))))
          goto switchD_0010d1ad_caseD_f;
        }
        lVar12 = lVar12 + 4;
        iVar5 = 0;
      } while (lVar12 != 0x14);
    }
    break;
  case 6:
  case 7:
  case 0xe:
    if (iVar4 < 0x10) goto LAB_0010d5af;
switchD_0010d1ad_caseD_1:
    if (iVar4 < 0x13) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
      uVar23 = x & 0xfffffff0U | 9;
      uVar24 = z & 0xfffffff0U | 9;
    }
    else {
      if (iVar4 < 0x16) {
        (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
      }
LAB_0010d464:
      uVar23 = uVar24 * 4 + 2;
      uVar24 = z_02 * 4 + 2;
    }
    iVar4 = getBiomeAt(g,0,uVar23,0x4f,uVar24);
    iVar5 = 0;
    if (-1 < iVar4) {
LAB_0010d493:
      iVar5 = g->mc;
LAB_0010d498:
      iVar4 = isViableFeatureBiome(iVar5,structureType,iVar4);
LAB_0010d4a2:
      biomeID = 0;
      iVar5 = 0;
      if (iVar4 != 0) {
switchD_0010d1ad_caseD_f:
        iVar5 = biomeID + (biomeID == 0);
      }
    }
    break;
  case 8:
    iVar5 = 0;
    if (iVar4 < 0xb) break;
    if (iVar4 == 0xb) {
      uVar24 = x & 0xfffffff0U | 8;
      z_02 = z & 0xfffffff0U | 8;
      iVar4 = 1;
LAB_0010d8ab:
      iVar5 = 0;
      iVar4 = getBiomeAt(g,iVar4,uVar24,0,z_02);
      if ((iVar4 < 0) || (iVar4 = isDeepOcean(iVar4), iVar4 == 0)) break;
    }
    else if (iVar4 < 0x16) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0x990);
      iVar4 = 0;
      goto LAB_0010d8ab;
    }
    uVar23 = x & 0xfffffff0U | 8;
    uVar24 = z & 0xfffffff0U | 8;
    if (g->mc - 0xcU < 10) {
      iVar4 = areBiomesViable(g,uVar23,0x3f,uVar24,0x10,0x7800001000000,0,0);
LAB_0010d9ba:
      iVar5 = 0;
      if (iVar4 == 0) break;
    }
    else if (0x15 < g->mc) {
      iVar4 = getBiomeAt(g,4,(int)uVar23 >> 2,9,(int)uVar24 >> 2);
      iVar4 = isDeepOcean(iVar4);
      goto LAB_0010d9ba;
    }
    iVar4 = areBiomesViable(g,uVar23,0x3f,uVar24,0x1d,0x7f00001000c81,0,0);
    goto LAB_0010d4a2;
  case 9:
    iVar5 = 0;
    if (iVar4 < 0xe) break;
    if (iVar4 < 0x16) {
      iVar4 = areBiomesViable(g,x & 0xfffffff0U | 8,0,z & 0xfffffff0U | 8,0x20,0x20000000,0x20000000
                              ,0);
      goto LAB_0010d4a2;
    }
    uVar23 = getBiomeAt(g,4,(x_00 & 0xfffffffc) + 1,0x4f,(z_01 & 0xfffffffc) + 1);
    if ((int)uVar23 < 0) break;
    iVar5 = 0;
    if (0xd < g->mc) {
      iVar5 = 0;
      biomeID = 0;
      if ((uVar23 & 0x7fffff7f) == 0x1d) goto switchD_0010d1ad_caseD_f;
      break;
    }
    goto LAB_0010d5b8;
  case 10:
    iVar5 = 0;
    if (iVar4 < 0x11) break;
    uVar7 = ((long)(z >> 8) << 4 ^ (long)(x >> 8) ^ g->seed ^ 0x5deece66d) * 0x5deece66d + 0xb;
    do {
      uVar7 = uVar7 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar17 = (int)(uVar7 >> 0x11);
      iVar10 = iVar17 + (int)((uVar7 >> 0x11) / 5) * -5;
    } while (-1 < (iVar10 - iVar17) + -5);
    if (iVar10 != 0) break;
    iVar10 = z_02 - 10;
    iVar15 = (uint)(0x15 < iVar4) * 2 + 0x20;
    iVar17 = z_02 + 10;
    bVar16 = iVar10 % iVar15 != 0 && (int)z_02 < 10;
    iVar25 = iVar17 / iVar15 - (uint)(iVar17 % iVar15 != 0 && (int)z_02 < -10);
    if ((int)(iVar10 / iVar15 - (uint)bVar16) <= iVar25) {
      uVar7 = (ulong)((uint)(0x15 < iVar4) * 2) | 0x18;
      iVar4 = uVar24 + 10;
      iVar1 = uVar24 - 10;
      iVar21 = iVar4 / iVar15 - (uint)(iVar4 % iVar15 != 0 && (int)uVar24 < -10);
      iVar27 = iVar1 / iVar15 - (uint)(iVar1 % iVar15 != 0 && (int)uVar24 < 10);
      local_160 = (long)(iVar10 / iVar15) - (ulong)bVar16;
      local_d0 = -(int)uVar7;
      local_120 = (long)iVar27 * 0x4f9939f508 + local_160 * 0x1ef1565bd5 + 0x9e7f70;
      do {
        if (iVar27 <= iVar21) {
          local_d8 = (int)local_160 * iVar15;
          lVar12 = local_120;
          iVar19 = (iVar21 - iVar27) + 1;
          iVar26 = iVar27 * iVar15;
          do {
            uVar13 = (g->seed + lVar12 ^ 0x5deece66d) * 0x5deece66d + 0xb;
            uVar14 = uVar13 >> 0x11;
            iVar11 = ((int)uVar14 + iVar26 + (int)((uVar14 & 0x7fffffff) / uVar7) * local_d0) * 0x10
            ;
            iVar5 = iVar11 >> 4;
            if ((iVar1 <= iVar5) && (iVar5 <= iVar4)) {
              z_00 = ((int)((uVar13 * 0x5deece66d + 0xb >> 0x11 & 0x7fffffff) % uVar7) + local_d8) *
                     0x10;
              iVar5 = z_00 >> 4;
              if ((iVar10 <= iVar5) && (iVar5 <= iVar17)) {
                iVar6 = g->mc;
                iVar5 = 0;
                if (0x12 < iVar6) goto LAB_0010d5b3;
                iVar11 = isViableStructurePos(5,g,iVar11,z_00,0);
                iVar5 = 0;
                if (iVar11 != 0) goto LAB_0010d5b1;
              }
            }
            iVar26 = iVar26 + iVar15;
            lVar12 = lVar12 + 0x4f9939f508;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
        local_160 = local_160 + 1;
        local_120 = local_120 + 0x1ef1565bd5;
      } while (iVar25 + 1 != (int)local_160);
      iVar4 = g->mc;
    }
    if (iVar4 < 0x16) {
      if (iVar4 < 0x13) {
        (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
        uVar23 = x & 0xfffffff0U | 9;
        uVar24 = z & 0xfffffff0U | 9;
      }
      else {
        (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
        uVar23 = uVar24 * 4 + 2;
        uVar24 = z_02 * 4 + 2;
      }
    }
    else {
      uVar8 = chunkGenerateRnd(g->seed,uVar24,z_02);
      uVar24 = ((uint)(uVar8 * 0x5deece66d + 0xb >> 0x2e) & 3) << 3;
      lVar22 = lVar22 * 0x20 + *(long *)(&DAT_0012e078 + uVar24);
      uVar23 = (uint)((ulong)(lVar22 - (lVar22 >> 0x3f)) >> 3);
      lVar18 = lVar18 * 0x20 + *(long *)(&DAT_0012e058 + uVar24);
      uVar24 = (uint)((ulong)(lVar18 - (lVar18 >> 0x3f)) >> 3);
    }
    iVar4 = getBiomeAt(g,0,uVar23,0x4f,uVar24);
    iVar5 = 0;
    if (iVar4 < 0) break;
    iVar5 = g->mc;
    structureType = 10;
    goto LAB_0010d498;
  case 0xb:
  case 0xc:
    iVar5 = 0;
    biomeID = 0;
    if (0x12 < iVar4) goto switchD_0010d1ad_caseD_f;
    break;
  case 0xd:
    if (iVar4 < 0x17) goto LAB_0010d5af;
LAB_0010d506:
    getVariant(&sv_1,structureType,iVar4,g->seed,x,z,-1);
    lVar22 = (long)sv_1.sx + lVar22 * 0x20;
    lVar18 = (long)sv_1.sz + lVar18 * 0x20;
    iVar4 = getBiomeAt(g,4,(int)(((lVar22 + (long)sv_1.x * 2) -
                                 (lVar22 + (long)sv_1.x * 2 + -1 >> 0x3f)) - 1U >> 3),
                       (int)sv_1.y >> 2,
                       (int)(((lVar18 + (long)sv_1.z * 2) - (lVar18 + (long)sv_1.z * 2 + -1 >> 0x3f)
                             ) - 1U >> 3));
    if (iVar4 < 0) goto LAB_0010d5af;
    goto LAB_0010d493;
  case 0xf:
    goto switchD_0010d1ad_caseD_f;
  case 0x10:
    if (iVar4 < 0x13) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
      x_00 = x;
      z_01 = z;
    }
    else if (iVar4 < 0x16) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
    }
    iVar4 = getBiomeAt(g,0,x_00,0x4f,z_01);
    iVar5 = 0;
    biomeID = 0;
    if (iVar4 == 2) goto switchD_0010d1ad_caseD_f;
    break;
  case 0x11:
    iVar5 = 0;
    biomeID = 0;
    if (0x14 < iVar4) goto switchD_0010d1ad_caseD_f;
    break;
  default:
    goto switchD_0010d1ad_caseD_12;
  case 0x17:
    if (iVar4 < 0x19) goto LAB_0010d5af;
    goto LAB_0010d464;
  case 0x18:
    if (0x19 < iVar4) goto LAB_0010d506;
LAB_0010d5af:
    iVar5 = 0;
  }
LAB_0010d5b1:
  iVar6 = g->mc;
LAB_0010d5b3:
  if (iVar6 < 0x16) {
LAB_0010d5b8:
    pLVar9 = &lbiome;
    pLVar20 = (g->field_5).field_0.ls.layers + 0x15;
    for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
      pLVar20->getMap = pLVar9->getMap;
      pLVar9 = (Layer *)((long)pLVar9 + (ulong)bVar28 * -0x10 + 8);
      pLVar20 = (Layer *)((long)pLVar20 + ((ulong)bVar28 * -2 + 1) * 8);
    }
    pLVar9 = &lshore;
    pLVar20 = (g->field_5).field_0.ls.layers + 0x22;
    for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
      pLVar20->getMap = pLVar9->getMap;
      pLVar9 = (Layer *)((long)pLVar9 + (ulong)bVar28 * -0x10 + 8);
      pLVar20 = (Layer *)((long)pLVar20 + ((ulong)bVar28 * -2 + 1) * 8);
    }
    (g->field_5).field_0.entry = local_118;
  }
  return iVar5;
}

Assistant:

int isViableStructurePos(int structureType, Generator *g, int x, int z, uint32_t flags)
{
    int approx = 0; // enables approximation levels
    int viable = 0;

    int64_t chunkX = x >> 4;
    int64_t chunkZ = z >> 4;

    // Structures are positioned at the chunk origin, but the biome check is
    // performed near the middle of the chunk [(9,9) in 1.13, TODO: check 1.7]
    // In 1.16 the biome check is always performed at (2,2) with layer scale=4.
    int sampleX, sampleZ, sampleY;
    int id;


    if (g->dim == DIM_NETHER)
    {
        if (structureType == Fortress && g->mc <= MC_1_17)
            return 1;
        if (g->mc <= MC_1_15)
            return 0;
        if (structureType == Ruined_Portal_N)
            return 1;
        if (structureType == Fortress)
        {   // in 1.18+ fortresses generate everywhere, where bastions don't
            StructureConfig sc;
            if (!getStructureConfig(Fortress, g->mc, &sc))
                return 0;
            Pos rp = {
                floordiv(x, sc.regionSize << 4),
                floordiv(z, sc.regionSize << 4)
            };
            if (!getStructurePos(Bastion, g->mc, g->seed, rp.x, rp.z, &rp))
                return 1;
            return !isViableStructurePos(Bastion, g, x, z, flags);
        }
        sampleY = 0;
        if (g->mc >= MC_1_18 && structureType == Bastion)
        {
            StructureVariant sv;
            getVariant(&sv, Bastion, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
            if (g->mc >= MC_1_19_2)
                sampleY = 33 >> 2; // nether biomes don't actually vary in Y
        }
        else
        {
            sampleX = (chunkX * 4) + 2;
            sampleZ = (chunkZ * 4) + 2;
        }
        id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        return isViableFeatureBiome(g->mc, structureType, id);
    }
    else if (g->dim == DIM_END)
    {
        switch (structureType)
        {
        case End_City:
            if (g->mc <= MC_1_8) return 0;
            break;
        case End_Gateway:
            if (g->mc <= MC_1_12) return 0;
            break;
        default:
            return 0;
        }
        // End biomes vary only on a per-chunk scale (1:16)
        // voronoi pre-1.15 shouldn't matter for End Cities as the check will
        // be near the chunk center
        id = getBiomeAt(g, 16, chunkX, 0, chunkZ);
        return isViableFeatureBiome(g->mc, structureType, id) ? id : 0;
    }

    // Overworld

    Layer lbiome, lshore, *entry = 0;
    int data[2] = { structureType, g->mc };

    if (g->mc <= MC_1_17)
    {
        lbiome = g->ls.layers[L_BIOME_256];
        lshore = g->ls.layers[L_SHORE_16];
        entry = g->entry;

        g->ls.layers[L_BIOME_256].data = (void*) data;
        g->ls.layers[L_BIOME_256].getMap = mapViableBiome;
        g->ls.layers[L_SHORE_16].data = (void*) data;
        g->ls.layers[L_SHORE_16].getMap = mapViableShore;
    }

    switch (structureType)
    {
    case Trail_Ruins:
        if (g->mc <= MC_1_19) goto L_not_viable;
        goto L_feature;
    case Ocean_Ruin:
    case Shipwreck:
    case Treasure:
        if (g->mc <= MC_1_12) goto L_not_viable;
        goto L_feature;
    case Igloo:
        if (g->mc <= MC_1_8) goto L_not_viable;
        goto L_feature;
    case Desert_Pyramid:
    case Jungle_Pyramid:
    case Swamp_Hut:
L_feature:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Desert_Well:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = x;
            sampleZ = z;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = x >> 2;
            sampleZ = z >> 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Village:
        if (g->mc <= MC_1_17)
        {
            if (g->mc == MC_1_15)
            {   // exclusively in MC_1_15, villages used the same biome check
                // as other structures
                g->entry = &g->ls.layers[L_VORONOI_1];
                sampleX = chunkX * 16 + 9;
                sampleZ = chunkZ * 16 + 9;
            }
            else
            {
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
                sampleX = chunkX * 4 + 2;
                sampleZ = chunkZ * 4 + 2;
            }
            id = getBiomeAt(g, 0, sampleX, 0, sampleZ);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
            if (flags && (uint32_t) id != flags)
                goto L_not_viable;
            if (g->mc <= MC_1_9)
            {   // before MC_1_10 villages did not spread into invalid biomes,
                // which could cause them to fail to generate on the first
                // check at block (2, 2) in the starting chunk
                sampleX = chunkX * 16 + 2;
                sampleZ = chunkZ * 16 + 2;
                id = getBiomeAt(g, 1, sampleX, 0, sampleZ);
                if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                    goto L_not_viable;
            }
            viable = id; // biome for viablility, useful for further analysis
            goto L_viable;
        }
        else
        {   // In 1.18 village types are checked separtely...
            const int vv[] = { plains, desert, savanna, taiga, snowy_tundra };
            size_t i;
            for (i = 0; i < sizeof(vv)/sizeof(int); i++) {
                if (flags && flags != (uint32_t) vv[i])
                    continue;
                StructureVariant sv;
                getVariant(&sv, Village, g->mc, g->seed, x, z, vv[i]);
                sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
                sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
                sampleY = 319 >> 2;
                id = getBiomeAt(g, 0, sampleX, sampleY, sampleZ);
                if (id == vv[i] || (id == meadow && vv[i] == plains)) {
                    viable = vv[i];
                    goto L_viable;
                }
            }
            goto L_not_viable;
        }

    case Outpost:
    {
        if (g->mc <= MC_1_13)
            goto L_not_viable;
        uint64_t rng = g->seed;
        setAttemptSeed(&rng, chunkX, chunkZ);
        if (nextInt(&rng, 5) != 0)
            goto L_not_viable;
        // look for villages within 10 chunks
        StructureConfig vilconf;
        if (!getStructureConfig(Village, g->mc, &vilconf))
            goto L_not_viable;
        int cx0 = (chunkX-10), cx1 = (chunkX+10);
        int cz0 = (chunkZ-10), cz1 = (chunkZ+10);
        int rx0 = floordiv(cx0, vilconf.regionSize);
        int rx1 = floordiv(cx1, vilconf.regionSize);
        int rz0 = floordiv(cz0, vilconf.regionSize);
        int rz1 = floordiv(cz1, vilconf.regionSize);
        int rx, rz;
        for (rz = rz0; rz <= rz1; rz++)
        {
            for (rx = rx0; rx <= rx1; rx++)
            {
                Pos p = getFeaturePos(vilconf, g->seed, rx, rz);
                int cx = p.x >> 4, cz = p.z >> 4;
                if (cx >= cx0 && cx <= cx1 && cz >= cz0 && cz <= cz1)
                {
                    if (g->mc >= MC_1_16_1)
                        goto L_not_viable;
                    if (isViableStructurePos(Village, g, p.x, p.z, 0))
                        goto L_not_viable;
                }
            }
        }
        if (g->mc >= MC_1_18)
        {
            rng = chunkGenerateRnd(g->seed, chunkX, chunkZ);
            switch (nextInt(&rng, 4)) {
                case 0: sampleX = +15; sampleZ = +15; break;
                case 1: sampleX = -15; sampleZ = +15; break;
                case 2: sampleX = -15; sampleZ = -15; break;
                case 3: sampleX = +15; sampleZ = -15; break;
                default: return 0; // unreachable
            }
            sampleX = (chunkX * 32 + sampleX) / 2 >> 2;
            sampleZ = (chunkZ * 32 + sampleZ) / 2 >> 2;
        }
        else if (g->mc >= MC_1_16_1)
        {
            g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        else
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;
    }

    case Monument:
        if (g->mc <= MC_1_7)
            goto L_not_viable;
        else if (g->mc == MC_1_8)
        {   // In 1.8 monuments require only a single deep ocean block.
            id = getBiomeAt(g, 1, chunkX * 16 + 8, 0, chunkZ * 16 + 8);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        else if (g->mc <= MC_1_17)
        {   // Monuments require two viability checks with the ocean layer
            // branch => worth checking for potential deep ocean beforehand.
            g->entry = &g->ls.layers[L_SHORE_16];
            id = getBiomeAt(g, 0, chunkX, 0, chunkZ);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        sampleX = chunkX * 16 + 8;
        sampleZ = chunkZ * 16 + 8;
        if (g->mc >= MC_1_9 && g->mc <= MC_1_17)
        {   // check for deep ocean center
            if (!areBiomesViable(g, sampleX, 63, sampleZ, 16, g_monument_biomes2, 0, approx))
                goto L_not_viable;
        }
        else if (g->mc >= MC_1_18)
        {   // check is done at y level of ocean floor - approx. with y = 36
            id = getBiomeAt(g, 4, sampleX>>2, 36>>2, sampleZ>>2);
            if (!isDeepOcean(id))
                goto L_not_viable;
        }
        if (areBiomesViable(g, sampleX, 63, sampleZ, 29, g_monument_biomes1, 0, approx))
            goto L_viable;
        goto L_not_viable;

    case Mansion:
        if (g->mc <= MC_1_10)
            goto L_not_viable;
        if (g->mc <= MC_1_17)
        {
            sampleX = chunkX * 16 + 8;
            sampleZ = chunkZ * 16 + 8;
            uint64_t b = (1ULL << dark_forest);
            uint64_t m = (1ULL << (dark_forest_hills-128));
            if (!areBiomesViable(g, sampleX, 0, sampleZ, 32, b, m, approx))
                goto L_not_viable;
        }
        else
        {   // In 1.18 the generation gets the minimum surface height among the
            // four structure corners (note structure has rotation).
            // This minimum height has to be y >= 60. The biome check is done
            // at the center position at that height.
            // TODO: get surface height
            sampleX = chunkX * 16 + 7;
            sampleZ = chunkZ * 16 + 7;
            id = getBiomeAt(g, 4, sampleX>>2, 319>>2, sampleZ>>2);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
        }
        goto L_viable;

    case Ruined_Portal:
    case Ruined_Portal_N:
        if (g->mc <= MC_1_15)
            goto L_not_viable;
        goto L_viable;

    case Geode:
        if (g->mc <= MC_1_16)
            goto L_not_viable;
        goto L_viable;

    case Ancient_City:
        if (g->mc <= MC_1_18) goto L_not_viable;
        goto L_jigsaw;

    case Trial_Chambers:
        if (g->mc <= MC_1_20) goto L_not_viable;
L_jigsaw:
        {
            StructureVariant sv;
            getVariant(&sv, structureType, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx - 1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz - 1) / 2 >> 2;
            sampleY = sv.y >> 2;
            id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        }
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Mineshaft:
        goto L_viable;

    default:
        fprintf(stderr,
                "isViableStructurePos: bad structure type %d or dimension %d\n",
                structureType, g->dim);
        goto L_not_viable;
    }

L_viable:
    if (!viable)
        viable = 1;
L_not_viable:
    if (g->mc <= MC_1_17)
    {
        g->ls.layers[L_BIOME_256] = lbiome;
        g->ls.layers[L_SHORE_16] = lshore;
        g->entry = entry;
    }
    return viable;
}